

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csp_clock.c
# Opt level: O0

void csp_clock_get_time(csp_timestamp_t *time)

{
  int iVar1;
  undefined4 *in_RDI;
  timespec ts;
  timespec local_18;
  undefined4 *local_8;
  
  local_8 = in_RDI;
  iVar1 = clock_gettime(0,&local_18);
  if (iVar1 == 0) {
    *local_8 = (undefined4)local_18.tv_sec;
    local_8[1] = (undefined4)local_18.tv_nsec;
  }
  else {
    *local_8 = 0;
    local_8[1] = 0;
  }
  return;
}

Assistant:

__weak void csp_clock_get_time(csp_timestamp_t * time) {

	struct timespec ts;
	if (clock_gettime(CLOCK_REALTIME, &ts) == 0) {
		time->tv_sec = ts.tv_sec;
		time->tv_nsec = ts.tv_nsec;
	} else {
		time->tv_sec = 0;
		time->tv_nsec = 0;
	}
}